

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * cargo_get_fprintl_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,cargo_highlight_t *highlights_in)

{
  char *__s;
  size_t sVar1;
  uint uVar2;
  void *__base;
  size_t sVar3;
  size_t sVar4;
  char *__ptr;
  void *__s_00;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  cargo_str_t str;
  cargo_str_t local_50;
  
  if (highlights_in == (cargo_highlight_t *)0x0) {
    __assert_fail("highlights_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x12de,
                  "char *cargo_get_fprintl_args(int, char **, int, cargo_fprint_flags_t, size_t, size_t, const cargo_highlight_t *)"
                 );
  }
  if (max_width == 0) {
    uVar2 = _cargo_get_console_width();
    max_width = 0x50;
    if (0 < (int)uVar2) {
      max_width = (size_t)uVar2;
    }
  }
  uVar9 = 0x400;
  if (max_width < 0x400) {
    uVar9 = max_width;
  }
  __base = _cargo_calloc(highlight_count,0x20);
  if (__base == (void *)0x0) {
    return (char *)0x0;
  }
  uVar2 = (uint)highlight_count;
  if (0 < (int)uVar2) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)__base + lVar5 * 2) = *(undefined4 *)((long)&highlights_in->i + lVar5);
      *(undefined8 *)((long)__base + lVar5 * 2 + 8) =
           *(undefined8 *)((long)&highlights_in->c + lVar5);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar2 & 0x7fffffff) << 4 != lVar5);
  }
  qsort(__base,highlight_count,0x20,_cargo_compare_highlights);
  if (argc < 1) {
    sVar3 = 4;
LAB_001051bf:
    if (replaced_cargo_malloc == (cargo_malloc_f)0x0) {
      __ptr = (char *)malloc(sVar3);
    }
    else {
      __ptr = (char *)(*replaced_cargo_malloc)(sVar3);
    }
    if (__ptr != (char *)0x0) {
      local_50.offset = 0;
      local_50.s = __ptr;
      local_50.l = sVar3;
      if ((flags & CARGO_FPRINT_NOARGS) == 0) {
        if (start < argc) {
          lVar5 = (long)start;
          do {
            sVar1 = local_50.offset;
            __s = argv[lVar5];
            sVar3 = strlen(__s);
            if (uVar9 <= sVar3 + sVar1) break;
            cargo_appendf(&local_50,"%s ",__s);
            lVar5 = lVar5 + 1;
          } while (argc != lVar5);
        }
        cargo_appendf(&local_50,"\n");
      }
      if ((char)((flags & CARGO_FPRINT_NOHIGHLIGHT) >> 2) == '\0' && 0 < (int)uVar2) {
        uVar9 = (ulong)(uVar2 & 0x7fffffff);
        piVar13 = (int *)((long)__base + 0x1c);
        do {
          sVar3 = strlen(*(char **)(piVar13 + -5));
          sVar4 = (size_t)piVar13[-1];
          if (sVar4 != 0) {
            if (replaced_cargo_malloc == (cargo_malloc_f)0x0) {
              __s_00 = malloc(sVar4);
            }
            else {
              __s_00 = (*replaced_cargo_malloc)(sVar4);
            }
            if (__s_00 == (void *)0x0) goto LAB_001053b4;
            memset(__s_00,(uint)**(byte **)(piVar13 + -5),(long)piVar13[-1]);
            if (((flags & CARGO_FPRINT_NOCOLOR) == 0) && (1 < sVar3)) {
              if (*piVar13 != 0) {
                cargo_appendf(&local_50,"%s",*(long *)(piVar13 + -5) + 1);
              }
              cargo_appendf(&local_50,"%*s%*.*s",(ulong)(uint)piVar13[-3],"",
                            (ulong)(uint)piVar13[-1],(ulong)(uint)piVar13[-1],__s_00);
              if (*piVar13 != 0) {
                cargo_appendf(&local_50,"%s","\x1b[0m");
              }
            }
            else {
              cargo_appendf(&local_50,"%*s%*.*s",(ulong)(uint)piVar13[-3],"",
                            (ulong)(uint)piVar13[-1],(ulong)(uint)piVar13[-1],__s_00);
            }
            if (replaced_cargo_free == (cargo_free_f)0x0) {
              free(__s_00);
            }
            else {
              (*replaced_cargo_free)(__s_00);
            }
          }
          piVar13 = piVar13 + 8;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      goto LAB_001053cb;
    }
  }
  else {
    lVar10 = (long)start;
    uVar12 = 0;
    uVar8 = 0;
    lVar5 = 0;
    iVar11 = 0;
    do {
      if ((long)uVar12 < lVar10) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(argv[uVar12]);
      }
      lVar7 = (long)iVar11;
      if (uVar9 <= lVar7 + sVar3) break;
      if (((int)uVar8 < (int)uVar2) &&
         (lVar6 = (long)(int)uVar8 * 0x20, uVar12 == *(uint *)((long)__base + lVar6))) {
        if (lVar10 <= (long)uVar12) {
          *(undefined4 *)((long)__base + lVar6 + 0x1c) = 1;
        }
        *(int *)((long)__base + lVar6 + 0x18) = (int)sVar3;
        *(int *)((long)__base + lVar6 + 0x14) = iVar11;
        if (0 < (int)uVar8) {
          iVar11 = iVar11 - (*(int *)((long)__base + (ulong)uVar8 * 0x20 + -0xc) +
                            *(int *)((long)__base + (ulong)uVar8 * 0x20 + -8));
        }
        *(int *)((long)__base + lVar6 + 0x10) = iVar11;
        sVar4 = strlen(*(char **)((long)__base + lVar6 + 8));
        lVar5 = lVar5 + sVar4;
        uVar8 = uVar8 + 1;
      }
      iVar11 = (uint)(lVar10 <= (long)uVar12) + (int)(lVar7 + sVar3);
      lVar5 = lVar5 + iVar11;
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
    sVar3 = lVar5 * 2 + 4;
    if (sVar3 != 0) goto LAB_001051bf;
  }
  __ptr = (char *)0x0;
LAB_001053b4:
  if (replaced_cargo_free == (cargo_free_f)0x0) {
    free(__ptr);
  }
  else {
    (*replaced_cargo_free)(__ptr);
  }
  __ptr = (char *)0x0;
LAB_001053cb:
  if (replaced_cargo_free == (cargo_free_f)0x0) {
    free(__base);
  }
  else {
    (*replaced_cargo_free)(__base);
  }
  return __ptr;
}

Assistant:

char *cargo_get_fprintl_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count,
                            const cargo_highlight_t *highlights_in)
{
    char *ret = NULL;
    int i;
    int j;
    int global_indent = 0;
    size_t arglen = 0;
    cargo_str_t str;
    char *out = NULL;
    size_t out_size = 0;
    cargo_phighlight_t *highlights = NULL;
    assert(highlights_in);

    max_width = _cargo_process_max_width(max_width);

    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_phighlight_t))))
    {
        CARGODBG(1, "Out of memory!\n");
        return NULL;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = highlights_in[i].i;
        highlights[i].c = highlights_in[i].c;
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }

    CARGODBG(6, "  Sort highlights:\n");
    qsort(highlights, highlight_count,
        sizeof(cargo_phighlight_t), _cargo_compare_highlights);

    #if (CARGO_DEBUG >= 6)
    for (i = 0; i < (int)highlight_count; i++)
    {
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }
    #endif

    // Get buffer size and highlight data.
    for (i = 0, j = 0; i < argc; i++)
    {
        arglen = (i >= start) ? strlen(argv[i]) : 0;

        if (arglen + global_indent >= max_width)
        {
            break;
        }

        if (j < (int)highlight_count)
        {
            cargo_phighlight_t *h = &highlights[j];
            if (h->i == i)
            {
                // We only keep this flag so that we can make sure we don't
                // output the color codes when an index is out of range.
                if (i >= start)
                {
                    h->show = 1;
                }

                h->highlight_len = (int)arglen;
                h->total_indent = global_indent;

                // We want to indent in relation to the previous indentation.
                if (j > 0)
                {
                    cargo_phighlight_t *hprev = &highlights[j - 1];
                    h->indent = h->total_indent
                              - (hprev->total_indent + hprev->highlight_len);
                }
                else
                {
                    h->indent = h->total_indent;
                }

                // If we use color, we must include the ANSI color code length
                // in the buffer length as well.
                out_size += strlen(h->c);

                j++;
            }
        }

        global_indent += arglen;
        if (i >= start) global_indent++; // + 1 for space.
        out_size += global_indent;
    }

    // Allocate and fill buffer.
    out_size += 2; // New lines.
    out_size *= 2; // Two rows, one for args and one for highlighting.

    if (!(out = _cargo_malloc(out_size)))
    {
        CARGODBG(1, "Out of memory!\n");
        goto fail;
    }

    str.s = out;
    str.l = out_size;
    str.offset = 0;

    // TODO: Try adding an "..." and try to fit all highlights on screen if possible.
    if (!(flags & CARGO_FPRINT_NOARGS))
    {
        for (i = start; i < argc; i++)
        {
            // The highlight will be incorrect if we allow a line break.
            if (str.offset + strlen(argv[i]) >= max_width)
            {
                break;
            }

            cargo_appendf(&str, "%s ", argv[i]);
        }

        cargo_appendf(&str, "\n");
    }

    if (!(flags & CARGO_FPRINT_NOHIGHLIGHT))
    {
        for (i = 0; i < (int)highlight_count; i++)
        {
            cargo_phighlight_t *h = &highlights[i];
            char *highlvec;
            int has_color = strlen(h->c) > 1;

            if (h->highlight_len == 0)
                continue;

            if (!(highlvec = _cargo_malloc(h->highlight_len)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Use the first character as the highlight character.
            //                                ~~~~~~~~~
            memset(highlvec, *h->c, h->highlight_len);

            // If we have more characters, we append that as a string.
            // (This can be used for color ansi color codes).
            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", &h->c[1]);
            }

            cargo_appendf(&str, "%*s%*.*s",
                h->indent, "",
                h->highlight_len,
                h->highlight_len,
                highlvec);

            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", CARGO_COLOR_RESET);
            }

            _cargo_free(highlvec);
        }
    }

    ret = out;

fail:
    if (!ret) _cargo_free(out);
    _cargo_free(highlights);

    return ret;
}